

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

uint __thiscall ON_Brep::SizeOf(ON_Brep *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ON_Curve **ppOVar8;
  ON_Surface **ppOVar9;
  ON_Surface *s;
  ON_Curve *c3;
  ON_Curve *c2;
  uint sz;
  int count;
  int i;
  ON_Brep *this_local;
  
  uVar1 = ON_Object::SizeOf((ON_Object *)this);
  uVar2 = ON_SimpleArray<ON_Curve_*>::SizeOfArray(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>);
  uVar3 = ON_SimpleArray<ON_Curve_*>::SizeOfArray(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>);
  uVar4 = ON_SimpleArray<ON_Surface_*>::SizeOfArray(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>)
  ;
  c2._4_4_ = uVar4 + uVar3 + uVar2 + uVar1 + 0x128;
  iVar5 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>);
  for (sz = 0; (int)sz < iVar5; sz = sz + 1) {
    ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,sz);
    if (*ppOVar8 != (ON_Curve *)0x0) {
      iVar6 = (*((*ppOVar8)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])();
      c2._4_4_ = iVar6 + c2._4_4_;
    }
  }
  iVar5 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>);
  for (sz = 0; (int)sz < iVar5; sz = sz + 1) {
    ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,sz);
    if (*ppOVar8 != (ON_Curve *)0x0) {
      iVar6 = (*((*ppOVar8)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])();
      c2._4_4_ = iVar6 + c2._4_4_;
    }
  }
  iVar5 = ON_SimpleArray<ON_Surface_*>::Count(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>);
  for (sz = 0; (int)sz < iVar5; sz = sz + 1) {
    ppOVar9 = ON_SimpleArray<ON_Surface_*>::operator[]
                        (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,sz);
    if (*ppOVar9 != (ON_Surface *)0x0) {
      iVar6 = (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])();
      c2._4_4_ = iVar6 + c2._4_4_;
    }
  }
  uVar1 = ON_BrepVertexArray::SizeOf(&this->m_V);
  uVar2 = ON_BrepEdgeArray::SizeOf(&this->m_E);
  uVar3 = ON_BrepTrimArray::SizeOf(&this->m_T);
  uVar4 = ON_BrepLoopArray::SizeOf(&this->m_L);
  uVar7 = ON_BrepFaceArray::SizeOf(&this->m_F);
  return uVar7 + uVar4 + uVar3 + uVar2 + uVar1 + c2._4_4_;
}

Assistant:

unsigned int ON_Brep::SizeOf() const
{
  int i, count;

  unsigned int sz = ON_Geometry::SizeOf();
  sz += (sizeof(*this) - sizeof(ON_Geometry));
  sz += m_C2.SizeOfArray();
  sz += m_C3.SizeOfArray();
  sz += m_S.SizeOfArray();

  count = m_C2.Count();
  for ( i = 0; i < count; i++ )
  {
    const ON_Curve* c2 = m_C2[i];
    if ( c2 )
      sz += c2->SizeOf();
  }

  count = m_C3.Count();
  for ( i = 0; i < count; i++ )
  {
    const ON_Curve* c3 = m_C3[i];
    if ( c3 )
      sz += c3->SizeOf();
  }

  count = m_S.Count();
  for ( i = 0; i < count; i++ )
  {
    const ON_Surface* s = m_S[i];
    if ( s )
      sz += s->SizeOf();
  }

  sz += m_V.SizeOf();
  sz += m_E.SizeOf();
  sz += m_T.SizeOf();
  sz += m_L.SizeOf();
  sz += m_F.SizeOf();

  return sz;
}